

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

bool __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
::try_merge_or_rebalance
          (btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
           *this,iterator *iter)

{
  int iVar1;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *pbVar2;
  field_type fVar3;
  byte bVar4;
  byte bVar5;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *pbVar6;
  template_ElementType<3UL> *ppbVar7;
  int iVar8;
  
  pbVar6 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
           ::parent(iter->node);
  fVar3 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
          ::position(iter->node);
  if (fVar3 != '\0') {
    bVar4 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::position(iter->node);
    ppbVar7 = btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,true>>
              ::GetField<3ul>((btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,true>>
                               *)pbVar6);
    pbVar2 = ppbVar7[(ulong)bVar4 - 1];
    fVar3 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::max_count(pbVar2);
    if (fVar3 != '\a') {
      __assert_fail("left->max_count() == kNodeValues",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xbc5,
                    "bool phmap::priv::btree<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, true>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, true>]"
                   );
    }
    bVar4 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::count(pbVar2);
    bVar5 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::count(iter->node);
    if ((uint)bVar5 + (uint)bVar4 + 1 < 8) {
      bVar4 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
              ::count(pbVar2);
      iter->position = (uint)bVar4 + iter->position + 1;
      merge_nodes(this,pbVar2,iter->node);
      iter->node = pbVar2;
      return true;
    }
  }
  bVar4 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
          ::position(iter->node);
  bVar5 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
          ::count(pbVar6);
  if (bVar4 < bVar5) {
    bVar4 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::position(iter->node);
    ppbVar7 = btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,true>>
              ::GetField<3ul>((btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,true>>
                               *)pbVar6);
    pbVar2 = ppbVar7[(ulong)bVar4 + 1];
    fVar3 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::max_count(pbVar2);
    if (fVar3 != '\a') {
      __assert_fail("right->max_count() == kNodeValues",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xbd0,
                    "bool phmap::priv::btree<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, true>>::try_merge_or_rebalance(iterator *) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, true>]"
                   );
    }
    bVar4 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::count(iter->node);
    bVar5 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::count(pbVar2);
    if ((uint)bVar5 + (uint)bVar4 + 1 < 8) {
      merge_nodes(this,iter->node,pbVar2);
      return true;
    }
    bVar4 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::count(pbVar2);
    if ((3 < bVar4) &&
       ((fVar3 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                 ::count(iter->node), fVar3 == '\0' || (0 < iter->position)))) {
      bVar4 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
              ::count(pbVar2);
      bVar5 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
              ::count(iter->node);
      iVar8 = (int)((short)((ushort)bVar4 - (ushort)bVar5) / 2);
      bVar4 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
              ::count(pbVar2);
      iVar1 = bVar4 - 1;
      if (iVar8 <= (int)(bVar4 - 1)) {
        iVar1 = iVar8;
      }
      btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
      ::rebalance_right_to_left(iter->node,iVar1,pbVar2,(allocator_type *)this);
      return false;
    }
  }
  fVar3 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
          ::position(iter->node);
  if (fVar3 != '\0') {
    bVar4 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::position(iter->node);
    ppbVar7 = btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,true>>
              ::GetField<3ul>((btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,true>>
                               *)pbVar6);
    pbVar6 = ppbVar7[(ulong)bVar4 - 1];
    bVar4 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::count(pbVar6);
    if ((3 < bVar4) &&
       ((fVar3 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                 ::count(iter->node), fVar3 == '\0' ||
        (iVar1 = iter->position,
        bVar4 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                ::count(iter->node), iVar1 < (int)(uint)bVar4)))) {
      bVar4 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
              ::count(pbVar6);
      bVar5 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
              ::count(iter->node);
      iVar8 = (int)((short)((ushort)bVar4 - (ushort)bVar5) / 2);
      bVar4 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
              ::count(pbVar6);
      iVar1 = bVar4 - 1;
      if (iVar8 <= (int)(bVar4 - 1)) {
        iVar1 = iVar8;
      }
      btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
      ::rebalance_left_to_right(pbVar6,iVar1,iter->node,(allocator_type *)this);
      iter->position = iter->position + iVar1;
    }
  }
  return false;
}

Assistant:

bool btree<P>::try_merge_or_rebalance(iterator *iter) {
        node_type *parent = iter->node->parent();
        if (iter->node->position() > 0) {
            // Try merging with our left sibling.
            node_type *left = parent->child(iter->node->position() - 1);
            assert(left->max_count() == kNodeValues);
            if ((1 + left->count() + iter->node->count()) <= kNodeValues) {
                iter->position += 1 + left->count();
                merge_nodes(left, iter->node);
                iter->node = left;
                return true;
            }
        }
        if (iter->node->position() < parent->count()) {
            // Try merging with our right sibling.
            node_type *right = parent->child(iter->node->position() + 1);
            assert(right->max_count() == kNodeValues);
            if ((1 + iter->node->count() + right->count()) <= kNodeValues) {
                merge_nodes(iter->node, right);
                return true;
            }
            // Try rebalancing with our right sibling. We don't perform rebalancing if
            // we deleted the first element from iter->node and the node is not
            // empty. This is a small optimization for the common pattern of deleting
            // from the front of the tree.
            if ((right->count() > kMinNodeValues) &&
                ((iter->node->count() == 0) ||
                 (iter->position > 0))) {
                int to_move = (right->count() - iter->node->count()) / 2;
                to_move = (std::min)(to_move, right->count() - 1);
                iter->node->rebalance_right_to_left(to_move, right, mutable_allocator());
                return false;
            }
        }
        if (iter->node->position() > 0) {
            // Try rebalancing with our left sibling. We don't perform rebalancing if
            // we deleted the last element from iter->node and the node is not
            // empty. This is a small optimization for the common pattern of deleting
            // from the back of the tree.
            node_type *left = parent->child(iter->node->position() - 1);
            if ((left->count() > kMinNodeValues) &&
                ((iter->node->count() == 0) ||
                 (iter->position < iter->node->count()))) {
                int to_move = (left->count() - iter->node->count()) / 2;
                to_move = (std::min)(to_move, left->count() - 1);
                left->rebalance_left_to_right(to_move, iter->node, mutable_allocator());
                iter->position += to_move;
                return false;
            }
        }
        return false;
    }